

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linearizer.c
# Opt level: O1

Pseudo * linearize_concat_expression(Proc *proc,AstNode *expr)

{
  C_MemoryAllocator *pCVar1;
  PtrList *head;
  BasicBlock *pBVar2;
  long lVar3;
  long lVar4;
  undefined8 ptr;
  uint uVar5;
  undefined1 *ptr_00;
  ulong uVar6;
  AstNode *expr_00;
  Pseudo *pPVar7;
  Pseudo *pPVar8;
  Pseudo *ptr_01;
  long lVar9;
  undefined8 auStack_80 [2];
  undefined1 local_70 [8];
  PtrListIterator niter__;
  
  uVar5 = expr->line_number;
  pCVar1 = proc->linearizer->compiler_state->allocator;
  auStack_80[0] = 0x11af22;
  ptr_00 = (undefined1 *)(*pCVar1->calloc)(pCVar1->arena,1,0x28);
  *ptr_00 = 0x5c;
  *(uint *)(ptr_00 + 0x20) = uVar5;
  auStack_80[0] = 0x11af3f;
  niter__._16_8_ = allocate_temp_pseudo(proc,(expr->field_2).common_expr.type.type_code,true);
  auStack_80[0] = 0x11af4d;
  uVar5 = raviX_ptrlist_size((PtrList *)(expr->field_2).function_stmt.function_expr);
  uVar6 = (long)(int)uVar5 * 8 + 0xfU & 0xfffffffffffffff0;
  lVar3 = -0x78 - uVar6;
  lVar4 = lVar3 - uVar6;
  head = (PtrList *)(expr->field_2).function_stmt.function_expr;
  *(undefined8 *)((long)auStack_80 + lVar4 + 0x78) = 0x11af89;
  raviX_ptrlist_forward_iterator((PtrListIterator *)local_70,head);
  *(undefined8 *)((long)auStack_80 + lVar4 + 0x78) = 0x11af91;
  expr_00 = (AstNode *)raviX_ptrlist_iter_next((PtrListIterator *)local_70);
  if (expr_00 != (AstNode *)0x0) {
    lVar9 = 0;
    do {
      *(undefined8 *)((long)auStack_80 + lVar4 + 0x78) = 0x11afac;
      pPVar7 = linearize_expression(proc,expr_00);
      if (((undefined1  [48])*pPVar7 & (undefined1  [48])0xf) == (undefined1  [48])0xe) {
        *(undefined8 *)((long)auStack_80 + lVar4 + 0x78) = 0x11afc4;
        pPVar8 = indexed_load(proc,pPVar7);
        ptr_01 = pPVar8;
      }
      else {
        pPVar8 = (Pseudo *)0x0;
        ptr_01 = pPVar7;
      }
      pCVar1 = proc->linearizer->compiler_state->allocator;
      *(undefined8 *)((long)auStack_80 + lVar4 + 0x78) = 0x11afe4;
      raviX_ptrlist_add((PtrList **)(ptr_00 + 8),ptr_01,pCVar1);
      *(Pseudo **)((long)auStack_80 + lVar9 + lVar3 + 0x80) = pPVar8;
      *(Pseudo **)((long)auStack_80 + lVar9 + lVar4 + 0x80) = pPVar7;
      *(undefined8 *)((long)auStack_80 + lVar4 + 0x78) = 0x11affd;
      expr_00 = (AstNode *)raviX_ptrlist_iter_next((PtrListIterator *)local_70);
      lVar9 = lVar9 + 8;
    } while (expr_00 != (AstNode *)0x0);
  }
  ptr = niter__._16_8_;
  if ((*(uint *)niter__._16_8_ & 0xf) != 0xe) {
    pCVar1 = proc->linearizer->compiler_state->allocator;
    *(undefined8 *)((long)auStack_80 + lVar4 + 0x78) = 0x11b036;
    raviX_ptrlist_add((PtrList **)(ptr_00 + 0x10),(void *)ptr,pCVar1);
    if ((*(BasicBlock **)(ptr_00 + 0x18) != (BasicBlock *)0x0) &&
       (*(BasicBlock **)(ptr_00 + 0x18) != proc->current_bb)) {
      *(code **)((long)auStack_80 + lVar4 + 0x78) = check_pseudo_is_top;
      __assert_fail("insn->block == NULL || insn->block == proc->current_bb",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/ravicomp/src/linearizer.c"
                    ,0x1b1,"void add_instruction(Proc *, Instruction *)");
    }
    pBVar2 = proc->current_bb;
    pCVar1 = proc->linearizer->compiler_state->allocator;
    *(undefined8 *)((long)auStack_80 + lVar4 + 0x78) = 0x11b063;
    raviX_ptrlist_add((PtrList **)&pBVar2->insns,ptr_00,pCVar1);
    *(BasicBlock **)(ptr_00 + 0x18) = proc->current_bb;
    if (0 < (int)uVar5) {
      uVar6 = 0;
      do {
        pPVar7 = *(Pseudo **)((long)auStack_80 + uVar6 * 8 + lVar4 + 0x80);
        *(undefined8 *)((long)auStack_80 + lVar4 + 0x78) = 0x11b08a;
        free_temp_pseudo(proc,pPVar7,false);
        pPVar7 = *(Pseudo **)((long)auStack_80 + uVar6 * 8 + lVar3 + 0x80);
        if (pPVar7 != (Pseudo *)0x0) {
          *(undefined8 *)((long)auStack_80 + lVar4 + 0x78) = 0x11b0a1;
          free_temp_pseudo(proc,pPVar7,false);
        }
        uVar6 = uVar6 + 1;
      } while (uVar5 != uVar6);
    }
    return (Pseudo *)ptr;
  }
  *(undefined8 *)((long)auStack_80 + lVar4 + 0x78) = 0x11b0da;
  __assert_fail("pseudo->type != PSEUDO_INDEXED",
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/ravicomp/src/linearizer.c"
                ,0x193,"void add_instruction_target(Proc *, Instruction *, Pseudo *)");
}

Assistant:

static Pseudo *linearize_concat_expression(Proc *proc, AstNode *expr)
{
	Instruction *insn = allocate_instruction(proc, op_concat, expr->line_number);
	ravitype_t target_type = expr->string_concatenation_expr.type.type_code;
	Pseudo *target = allocate_temp_pseudo(proc, target_type, true);
	AstNode *n;
	int N = raviX_ptrlist_size((const PtrList *) expr->string_concatenation_expr.expr_list);
	Pseudo **tofreelist = (Pseudo **)alloca( N* sizeof(Pseudo *));
	Pseudo **operands = (Pseudo **)alloca( N * sizeof(Pseudo *));
	int i = 0;
	FOR_EACH_PTR(expr->string_concatenation_expr.expr_list, AstNode, n) {
		Pseudo *operand = linearize_expression(proc, n);
		Pseudo *tofree =  add_instruction_operand(proc, insn, operand);
		tofreelist[i] = tofree;
		operands[i] = operand;
		i++;
	}
	END_FOR_EACH_PTR(n)
	add_instruction_target(proc, insn, target);
	add_instruction(proc, insn);
	for (i=0; i < N; i++) {
		Pseudo *op = operands[i];
		free_temp_pseudo(proc, op, false);
		Pseudo *tofree = tofreelist[i];
		if (tofree)
			free_temp_pseudo(proc, tofree, false);
	}
	return target;
}